

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

Vec4 rr::resolveMultisamplePixel(MultisampleConstPixelBufferAccess *access,int x,int y)

{
  int iVar1;
  undefined4 in_register_00000034;
  int s;
  int y_00;
  Vector<float,_4> VVar2;
  Vec4 VVar3;
  Vec4 sum;
  Vector<float,_4> local_50 [2];
  
  tcu::Vector<float,_4>::Vector(local_50);
  for (y_00 = 0; iVar1 = *(int *)(CONCAT44(in_register_00000034,x) + 8), y_00 < iVar1;
      y_00 = y_00 + 1) {
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)(local_50 + 1),x,y_00,y);
    tcu::Vector<float,_4>::operator+=(local_50,local_50 + 1);
  }
  VVar2 = tcu::operator/((tcu *)access,local_50,(float)iVar1);
  VVar3.m_data[0] = VVar2.m_data[0];
  VVar3.m_data[1] = VVar2.m_data[1];
  VVar3.m_data[2] = VVar2.m_data[2];
  VVar3.m_data[3] = VVar2.m_data[3];
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 resolveMultisamplePixel (const MultisampleConstPixelBufferAccess& access, int x, int y)
{
	tcu::Vec4 sum;
	for (int s = 0; s < access.getNumSamples(); s++)
		sum += access.raw().getPixel(s, x, y);

	return sum / (float)access.getNumSamples();
}